

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O2

void __thiscall MessageCracker::~MessageCracker(MessageCracker *this)

{
  ~MessageCracker((MessageCracker *)&this[-1].super_MessageCracker.super_MessageCracker);
  return;
}

Assistant:

void process(const FIX::Message &message, const FIX::SessionID &sessionID) {
    FIX::Message echo = message;
    FIX::PossResend possResend(false);
    message.getHeader().getFieldIfSet(possResend);

    auto const &clOrdID = message.getField<FIX::ClOrdID>();

    std::pair<FIX::ClOrdID, FIX::SessionID> pair = std::make_pair(clOrdID, sessionID);

    if (possResend == true) {
      if (m_orderIDs.find(pair) != m_orderIDs.end()) {
        return;
      }
    }
    m_orderIDs.insert(pair);
    FIX::Session::sendToTarget(echo, sessionID);
  }